

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int mbedtls_x509_sig_alg_gets
              (char *buf,size_t size,mbedtls_x509_buf *sig_oid,mbedtls_pk_type_t pk_alg,
              mbedtls_md_type_t md_alg,void *sig_opts)

{
  char *__maxlen;
  size_t __s;
  mbedtls_md_type_t *pmVar1;
  int iVar2;
  mbedtls_md_info_t *md_info_00;
  mbedtls_md_info_t *md_info_01;
  char *local_98;
  char *local_88;
  mbedtls_md_info_t *mgf_md_info;
  mbedtls_md_info_t *md_info;
  mbedtls_pk_rsassa_pss_options *pss_opts;
  char *desc;
  size_t n;
  char *p;
  mbedtls_md_type_t *pmStack_38;
  int ret;
  void *sig_opts_local;
  mbedtls_md_type_t md_alg_local;
  mbedtls_pk_type_t pk_alg_local;
  mbedtls_x509_buf *sig_oid_local;
  size_t size_local;
  char *buf_local;
  
  pss_opts = (mbedtls_pk_rsassa_pss_options *)0x0;
  desc = (char *)size;
  n = (size_t)buf;
  pmStack_38 = (mbedtls_md_type_t *)sig_opts;
  sig_opts_local._0_4_ = md_alg;
  sig_opts_local._4_4_ = pk_alg;
  _md_alg_local = sig_oid;
  sig_oid_local = (mbedtls_x509_buf *)size;
  size_local = (size_t)buf;
  p._4_4_ = mbedtls_oid_get_sig_alg_desc(sig_oid,(char **)&pss_opts);
  if (p._4_4_ == 0) {
    p._4_4_ = snprintf((char *)n,(size_t)desc,"%s",pss_opts);
  }
  else {
    p._4_4_ = snprintf((char *)n,(size_t)desc,"???");
  }
  pmVar1 = pmStack_38;
  if ((p._4_4_ < 0) || (desc <= (char *)(long)p._4_4_)) {
    buf_local._4_4_ = -0x2980;
  }
  else {
    desc = desc + -(long)p._4_4_;
    n = (long)p._4_4_ + n;
    if (sig_opts_local._4_4_ == MBEDTLS_PK_RSASSA_PSS) {
      md_info_00 = mbedtls_md_info_from_type((mbedtls_md_type_t)sig_opts_local);
      md_info_01 = mbedtls_md_info_from_type(*pmVar1);
      __s = n;
      __maxlen = desc;
      if (md_info_00 == (mbedtls_md_info_t *)0x0) {
        local_88 = "???";
      }
      else {
        local_88 = mbedtls_md_get_name(md_info_00);
      }
      if (md_info_01 == (mbedtls_md_info_t *)0x0) {
        local_98 = "???";
      }
      else {
        local_98 = mbedtls_md_get_name(md_info_01);
      }
      iVar2 = snprintf((char *)__s,(size_t)__maxlen," (%s, MGF1-%s, 0x%02X)",local_88,local_98,
                       (ulong)pmVar1[1]);
      if ((iVar2 < 0) || (desc <= (char *)(long)iVar2)) {
        return -0x2980;
      }
      desc = desc + -(long)iVar2;
    }
    buf_local._4_4_ = (int)sig_oid_local - (int)desc;
  }
  return buf_local._4_4_;
}

Assistant:

int mbedtls_x509_sig_alg_gets( char *buf, size_t size, const mbedtls_x509_buf *sig_oid,
                       mbedtls_pk_type_t pk_alg, mbedtls_md_type_t md_alg,
                       const void *sig_opts )
{
    int ret;
    char *p = buf;
    size_t n = size;
    const char *desc = NULL;

    ret = mbedtls_oid_get_sig_alg_desc( sig_oid, &desc );
    if( ret != 0 )
        ret = mbedtls_snprintf( p, n, "???"  );
    else
        ret = mbedtls_snprintf( p, n, "%s", desc );
    MBEDTLS_X509_SAFE_SNPRINTF;

#if defined(MBEDTLS_X509_RSASSA_PSS_SUPPORT)
    if( pk_alg == MBEDTLS_PK_RSASSA_PSS )
    {
        const mbedtls_pk_rsassa_pss_options *pss_opts;
        const mbedtls_md_info_t *md_info, *mgf_md_info;

        pss_opts = (const mbedtls_pk_rsassa_pss_options *) sig_opts;

        md_info = mbedtls_md_info_from_type( md_alg );
        mgf_md_info = mbedtls_md_info_from_type( pss_opts->mgf1_hash_id );

        ret = mbedtls_snprintf( p, n, " (%s, MGF1-%s, 0x%02X)",
                              md_info ? mbedtls_md_get_name( md_info ) : "???",
                              mgf_md_info ? mbedtls_md_get_name( mgf_md_info ) : "???",
                              pss_opts->expected_salt_len );
        MBEDTLS_X509_SAFE_SNPRINTF;
    }
#else
    ((void) pk_alg);
    ((void) md_alg);
    ((void) sig_opts);
#endif /* MBEDTLS_X509_RSASSA_PSS_SUPPORT */

    return( (int)( size - n ) );
}